

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::RegistrarForTagAliases::RegistrarForTagAliases
          (RegistrarForTagAliases *this,char *alias,char *tag,SourceLineInfo *lineInfo)

{
  IMutableRegistryHub *pIVar1;
  undefined8 in_RCX;
  char *in_RDX;
  char *in_RSI;
  allocator local_79;
  string local_78 [39];
  allocator local_51;
  string local_50 [48];
  undefined8 local_20;
  char *local_18;
  char *local_10;
  
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  pIVar1 = getMutableRegistryHub();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_50,local_10,&local_51);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_78,local_18,&local_79);
  (*pIVar1->_vptr_IMutableRegistryHub[6])(pIVar1,local_50,local_78,local_20);
  std::__cxx11::string::~string(local_78);
  std::allocator<char>::~allocator((allocator<char> *)&local_79);
  std::__cxx11::string::~string(local_50);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  return;
}

Assistant:

RegistrarForTagAliases::RegistrarForTagAliases(char const* alias, char const* tag, SourceLineInfo const& lineInfo) {
        CATCH_TRY {
            getMutableRegistryHub().registerTagAlias(alias, tag, lineInfo);
        }